

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

int CompareToUpperCaseString(uint8_t *tld,size_t length,char *target)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  
  sVar3 = 0;
  while( true ) {
    if (length == sVar3) {
      return -(uint)(target[length] != '\0');
    }
    bVar2 = target[sVar3];
    if (bVar2 == 0) break;
    pbVar1 = tld + sVar3;
    sVar3 = sVar3 + 1;
    if (bVar2 != *pbVar1) {
      return -(uint)(*pbVar1 < bVar2) | 1;
    }
  }
  return 1;
}

Assistant:

static int CompareToUpperCaseString(const uint8_t * tld, size_t length, const char * target)
{
    int ret = 0;
    size_t j = 0;
    uint8_t * x = (uint8_t *)target;

    for (; j < length; j++)
    {
        if (x[j] == 0)
        {
            ret = 1; /* Target string is longer, thus larger */
            break;
        }
        else if (x[j] != tld[j]) {
            ret = (tld[j] < x[j]) ? -1 : 1;
            break;
        }
    }

    if (ret == 0 && j == length && x[j] != 0)
    {
        ret = -1; /* Target string is shorter, thus lower */
    }

    return ret;
}